

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O2

void __thiscall cmExprParserHelper::~cmExprParserHelper(cmExprParserHelper *this)

{
  std::__cxx11::string::~string((string *)&this->WarningString);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&this->InputBuffer);
  return;
}

Assistant:

cmExprParserHelper::~cmExprParserHelper() = default;